

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_MapEntryValueName_Test::TestBody
          (ValidationErrorTest_MapEntryValueName_Test *this)

{
  DescriptorProto *pDVar1;
  FieldDescriptorProto *this_00;
  uint32_t *puVar2;
  Arena *arena;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  FieldDescriptorProto *local_138;
  FieldDescriptorProto *value;
  undefined1 local_120 [8];
  FileDescriptorProto file_proto;
  ValidationErrorTest_MapEntryValueName_Test *this_local;
  
  file_proto.field_0._224_8_ = this;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_120);
  anon_unknown_532::FillValidMapEntry((FileDescriptorProto *)local_120);
  pDVar1 = FileDescriptorProto::mutable_message_type((FileDescriptorProto *)local_120,0);
  pDVar1 = DescriptorProto::mutable_nested_type(pDVar1,0);
  this_00 = DescriptorProto::mutable_field(pDVar1,1);
  local_138 = this_00;
  puVar2 = internal::HasBits<1>::operator[](&(this_00->field_0)._impl_._has_bits_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  arena = protobuf::MessageLite::GetArena((MessageLite *)this_00);
  internal::ArenaStringPtr::Set(&(this_00->field_0)._impl_.name_,"Value",arena);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher(&local_150,descriptor_unittest::(anonymous_namespace)::kMapEntryErrorMessage);
  ValidationErrorTest::BuildFileWithErrors
            (&this->super_ValidationErrorTest,(FileDescriptorProto *)local_120,&local_150);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Matcher(&local_150);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_120);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, MapEntryValueName) {
  FileDescriptorProto file_proto;
  FillValidMapEntry(&file_proto);
  FieldDescriptorProto* value =
      file_proto.mutable_message_type(0)->mutable_nested_type(0)->mutable_field(
          1);
  value->set_name("Value");
  BuildFileWithErrors(file_proto, kMapEntryErrorMessage);
}